

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  _Alloc_hider name_00;
  bool forResponseFile;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  long *plVar3;
  size_type *psVar4;
  string includeFlags;
  string name;
  string responseVar;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_70;
  string local_50;
  
  responseVar._M_dataplus._M_p = (pointer)&responseVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&responseVar,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&responseVar,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&responseVar);
  forResponseFile = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&responseVar);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar1 = &includeFlags.field_2;
  includeFlags._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includeFlags,"CMAKE_BUILD_TYPE","");
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
  std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != paVar1) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,&local_50,true);
  cmLocalGenerator::GetIncludeFlags
            (&includeFlags,(cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,false,forResponseFile,
             &local_50);
  if (includeFlags._M_string_length != 0) {
    if (forResponseFile) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&name,"includes_","");
      std::__cxx11::string::_M_append((char *)&name,(ulong)(lang->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&name);
      name_00 = name._M_dataplus;
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,lang)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile(&local_70,this,name_00._M_p,&includeFlags,makefile_depends);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x4c74c1);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        arg.field_2._M_allocated_capacity = *psVar4;
        arg.field_2._8_8_ = plVar3[3];
        arg._M_dataplus._M_p = (pointer)&arg.field_2;
      }
      else {
        arg.field_2._M_allocated_capacity = *psVar4;
        arg._M_dataplus._M_p = (pointer)*plVar3;
      }
      arg._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[5])(this->LocalGenerator,flags,&arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[5])(this->LocalGenerator,flags,&includeFlags);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != paVar1) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseVar._M_dataplus._M_p != &responseVar.field_2) {
    operator_delete(responseVar._M_dataplus._M_p,responseVar.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang)
{
  std::string responseVar = "CMAKE_";
  responseVar += lang;
  responseVar += "_USE_RESPONSE_FILE_FOR_INCLUDES";
  bool useResponseFile = this->Makefile->IsOn(responseVar);


  std::vector<std::string> includes;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes,
                                              this->GeneratorTarget,
                                              lang, config);

  std::string includeFlags =
    this->LocalGenerator->GetIncludeFlags(includes, this->GeneratorTarget,
                                          lang, false, useResponseFile,
                                          config);
  if(includeFlags.empty())
    {
    return;
    }

  if(useResponseFile)
    {
    std::string name = "includes_";
    name += lang;
    name += ".rsp";
    std::string arg = "@" +
      this->CreateResponseFile(name.c_str(), includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
    }
  else
    {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
    }
}